

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_traits.h
# Opt level: O0

void __thiscall
charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>::default_traits
          (default_traits<unsigned_char,_charls::triplet<unsigned_char>_> *this,
          int32_t arg_maximum_sample_value,int32_t arg_near_lossless,int32_t reset)

{
  int32_t iVar1;
  int32_t reset_local;
  int32_t arg_near_lossless_local;
  int32_t arg_maximum_sample_value_local;
  default_traits<unsigned_char,_charls::triplet<unsigned_char>_> *this_local;
  
  this->maximum_sample_value = arg_maximum_sample_value;
  this->near_lossless = arg_near_lossless;
  iVar1 = compute_range_parameter(this->maximum_sample_value,this->near_lossless);
  this->range = iVar1;
  iVar1 = log2_ceil(this->range);
  this->quantized_bits_per_pixel = iVar1;
  iVar1 = log2_ceil(this->maximum_sample_value);
  this->bits_per_pixel = iVar1;
  iVar1 = compute_limit_parameter(this->bits_per_pixel);
  this->limit = iVar1;
  this->reset_threshold = reset;
  return;
}

Assistant:

default_traits(const int32_t arg_maximum_sample_value, const int32_t arg_near_lossless,
                   const int32_t reset = default_reset_value) noexcept :
        maximum_sample_value{arg_maximum_sample_value},
        near_lossless{arg_near_lossless},
        range{compute_range_parameter(maximum_sample_value, near_lossless)},
        quantized_bits_per_pixel{log2_ceil(range)},
        bits_per_pixel{log2_ceil(maximum_sample_value)},
        limit{compute_limit_parameter(bits_per_pixel)},
        reset_threshold{reset}
    {
    }